

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::PatternMap::add
          (PatternMap *this,UnicodeString *basePattern,PtnSkeleton *skeleton,UnicodeString *value,
          UBool skeletonWasSpecified,UErrorCode *status)

{
  short sVar1;
  char16_t cVar2;
  PtnElem *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char16_t *pcVar11;
  PtnElem *pPVar12;
  PtnElem *pPVar13;
  PtnSkeleton *pPVar14;
  int iVar15;
  uint uVar16;
  UnicodeString *size;
  
  sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar15 = (basePattern->fUnion).fFields.fLength;
  }
  else {
    iVar15 = (int)sVar1 >> 5;
  }
  if (iVar15 == 0) {
    *status = U_ZERO_ERROR;
LAB_002e902d:
    *status = U_ILLEGAL_CHARACTER;
  }
  else {
    if (((int)sVar1 & 2U) == 0) {
      pcVar11 = (basePattern->fUnion).fFields.fArray;
    }
    else {
      pcVar11 = (basePattern->fUnion).fStackFields.fBuffer;
    }
    cVar2 = *pcVar11;
    *status = U_ZERO_ERROR;
    uVar16 = (ushort)cVar2 - 0x41;
    iVar15 = -0x41;
    if (0x19 < (ushort)uVar16) {
      uVar16 = (ushort)cVar2 - 0x61;
      iVar15 = -0x47;
      if (0x19 < (ushort)uVar16) goto LAB_002e902d;
    }
    pPVar13 = this->boot[iVar15 + (uint)(ushort)cVar2];
    if (pPVar13 == (PtnElem *)0x0) {
      pPVar13 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(ulong)uVar16);
      if (pPVar13 != (PtnElem *)0x0) {
        PtnElem::PtnElem(pPVar13,basePattern,value);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pPVar14 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)basePattern);
          if (pPVar14 != (PtnSkeleton *)0x0) {
            pPVar14->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_00479898;
            (pPVar14->original).chars[0] = '\0';
            (pPVar14->original).chars[1] = '\0';
            (pPVar14->original).chars[2] = '\0';
            (pPVar14->original).chars[3] = '\0';
            (pPVar14->original).chars[4] = '\0';
            (pPVar14->original).chars[5] = '\0';
            (pPVar14->original).chars[6] = '\0';
            (pPVar14->original).chars[7] = '\0';
            (pPVar14->original).chars[8] = '\0';
            (pPVar14->original).chars[9] = '\0';
            (pPVar14->original).chars[10] = '\0';
            (pPVar14->original).chars[0xb] = '\0';
            (pPVar14->original).chars[0xc] = '\0';
            (pPVar14->original).chars[0xd] = '\0';
            (pPVar14->original).chars[0xe] = '\0';
            (pPVar14->original).chars[0xf] = '\0';
            (pPVar14->original).lengths[0] = '\0';
            (pPVar14->original).lengths[1] = '\0';
            (pPVar14->original).lengths[2] = '\0';
            (pPVar14->original).lengths[3] = '\0';
            (pPVar14->original).lengths[4] = '\0';
            (pPVar14->original).lengths[5] = '\0';
            (pPVar14->original).lengths[6] = '\0';
            (pPVar14->original).lengths[7] = '\0';
            (pPVar14->original).lengths[8] = '\0';
            (pPVar14->original).lengths[9] = '\0';
            (pPVar14->original).lengths[10] = '\0';
            (pPVar14->original).lengths[0xb] = '\0';
            (pPVar14->original).lengths[0xc] = '\0';
            (pPVar14->original).lengths[0xd] = '\0';
            (pPVar14->original).lengths[0xe] = '\0';
            (pPVar14->original).lengths[0xf] = '\0';
            (pPVar14->baseOriginal).chars[0] = '\0';
            (pPVar14->baseOriginal).chars[1] = '\0';
            (pPVar14->baseOriginal).chars[2] = '\0';
            (pPVar14->baseOriginal).chars[3] = '\0';
            (pPVar14->baseOriginal).chars[4] = '\0';
            (pPVar14->baseOriginal).chars[5] = '\0';
            (pPVar14->baseOriginal).chars[6] = '\0';
            (pPVar14->baseOriginal).chars[7] = '\0';
            (pPVar14->baseOriginal).chars[8] = '\0';
            (pPVar14->baseOriginal).chars[9] = '\0';
            (pPVar14->baseOriginal).chars[10] = '\0';
            (pPVar14->baseOriginal).chars[0xb] = '\0';
            (pPVar14->baseOriginal).chars[0xc] = '\0';
            (pPVar14->baseOriginal).chars[0xd] = '\0';
            (pPVar14->baseOriginal).chars[0xe] = '\0';
            (pPVar14->baseOriginal).chars[0xf] = '\0';
            (pPVar14->baseOriginal).lengths[0] = '\0';
            (pPVar14->baseOriginal).lengths[1] = '\0';
            (pPVar14->baseOriginal).lengths[2] = '\0';
            (pPVar14->baseOriginal).lengths[3] = '\0';
            (pPVar14->baseOriginal).lengths[4] = '\0';
            (pPVar14->baseOriginal).lengths[5] = '\0';
            (pPVar14->baseOriginal).lengths[6] = '\0';
            (pPVar14->baseOriginal).lengths[7] = '\0';
            (pPVar14->baseOriginal).lengths[8] = '\0';
            (pPVar14->baseOriginal).lengths[9] = '\0';
            (pPVar14->baseOriginal).lengths[10] = '\0';
            (pPVar14->baseOriginal).lengths[0xb] = '\0';
            (pPVar14->baseOriginal).lengths[0xc] = '\0';
            (pPVar14->baseOriginal).lengths[0xd] = '\0';
            (pPVar14->baseOriginal).lengths[0xe] = '\0';
            (pPVar14->baseOriginal).lengths[0xf] = '\0';
            uVar4 = *(undefined8 *)skeleton->type;
            uVar5 = *(undefined8 *)(skeleton->type + 2);
            uVar6 = *(undefined8 *)(skeleton->type + 4);
            uVar7 = *(undefined8 *)(skeleton->type + 6);
            uVar8 = *(undefined8 *)(skeleton->type + 8);
            uVar9 = *(undefined8 *)(skeleton->type + 10);
            uVar10 = *(undefined8 *)(skeleton->type + 0xe);
            *(undefined8 *)(pPVar14->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
            *(undefined8 *)(pPVar14->type + 0xe) = uVar10;
            *(undefined8 *)(pPVar14->type + 8) = uVar8;
            *(undefined8 *)(pPVar14->type + 10) = uVar9;
            *(undefined8 *)(pPVar14->type + 4) = uVar6;
            *(undefined8 *)(pPVar14->type + 6) = uVar7;
            *(undefined8 *)pPVar14->type = uVar4;
            *(undefined8 *)(pPVar14->type + 2) = uVar5;
            uVar4 = *(undefined8 *)((skeleton->original).chars + 8);
            *(undefined8 *)(pPVar14->original).chars = *(undefined8 *)(skeleton->original).chars;
            *(undefined8 *)((pPVar14->original).chars + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->original).lengths + 8);
            *(undefined8 *)(pPVar14->original).lengths = *(undefined8 *)(skeleton->original).lengths
            ;
            *(undefined8 *)((pPVar14->original).lengths + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
            *(undefined8 *)(pPVar14->baseOriginal).chars =
                 *(undefined8 *)(skeleton->baseOriginal).chars;
            *(undefined8 *)((pPVar14->baseOriginal).chars + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
            *(undefined8 *)(pPVar14->baseOriginal).lengths =
                 *(undefined8 *)(skeleton->baseOriginal).lengths;
            *(undefined8 *)((pPVar14->baseOriginal).lengths + 8) = uVar4;
          }
          LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                    (&pPVar13->skeleton,pPVar14,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            pPVar13->skeletonWasSpecified = skeletonWasSpecified;
            if (0x60 < (ushort)cVar2) {
              this->boot[(ushort)cVar2 - 0x47] = pPVar13;
              return;
            }
            *(PtnElem **)((long)this + (ulong)(ushort)cVar2 * 8 + -0x200) = pPVar13;
            return;
          }
        }
        goto LAB_002e90fd;
      }
    }
    else {
      size = basePattern;
      pPVar12 = getDuplicateElem(this,basePattern,skeleton,pPVar13);
      if (pPVar12 != (PtnElem *)0x0) {
        if (this->isDupAllowed == '\0') {
          return;
        }
        icu_63::UnicodeString::operator=(&pPVar12->pattern,value);
        pPVar12->skeletonWasSpecified = skeletonWasSpecified;
        return;
      }
      do {
        pPVar12 = pPVar13;
        pPVar13 = (pPVar12->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
      } while (pPVar13 != (PtnElem *)0x0);
      pPVar13 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(size_t)size);
      if (pPVar13 != (PtnElem *)0x0) {
        PtnElem::PtnElem(pPVar13,basePattern,value);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pPVar14 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)basePattern);
          if (pPVar14 != (PtnSkeleton *)0x0) {
            pPVar14->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_00479898;
            (pPVar14->original).chars[0] = '\0';
            (pPVar14->original).chars[1] = '\0';
            (pPVar14->original).chars[2] = '\0';
            (pPVar14->original).chars[3] = '\0';
            (pPVar14->original).chars[4] = '\0';
            (pPVar14->original).chars[5] = '\0';
            (pPVar14->original).chars[6] = '\0';
            (pPVar14->original).chars[7] = '\0';
            (pPVar14->original).chars[8] = '\0';
            (pPVar14->original).chars[9] = '\0';
            (pPVar14->original).chars[10] = '\0';
            (pPVar14->original).chars[0xb] = '\0';
            (pPVar14->original).chars[0xc] = '\0';
            (pPVar14->original).chars[0xd] = '\0';
            (pPVar14->original).chars[0xe] = '\0';
            (pPVar14->original).chars[0xf] = '\0';
            (pPVar14->original).lengths[0] = '\0';
            (pPVar14->original).lengths[1] = '\0';
            (pPVar14->original).lengths[2] = '\0';
            (pPVar14->original).lengths[3] = '\0';
            (pPVar14->original).lengths[4] = '\0';
            (pPVar14->original).lengths[5] = '\0';
            (pPVar14->original).lengths[6] = '\0';
            (pPVar14->original).lengths[7] = '\0';
            (pPVar14->original).lengths[8] = '\0';
            (pPVar14->original).lengths[9] = '\0';
            (pPVar14->original).lengths[10] = '\0';
            (pPVar14->original).lengths[0xb] = '\0';
            (pPVar14->original).lengths[0xc] = '\0';
            (pPVar14->original).lengths[0xd] = '\0';
            (pPVar14->original).lengths[0xe] = '\0';
            (pPVar14->original).lengths[0xf] = '\0';
            (pPVar14->baseOriginal).chars[0] = '\0';
            (pPVar14->baseOriginal).chars[1] = '\0';
            (pPVar14->baseOriginal).chars[2] = '\0';
            (pPVar14->baseOriginal).chars[3] = '\0';
            (pPVar14->baseOriginal).chars[4] = '\0';
            (pPVar14->baseOriginal).chars[5] = '\0';
            (pPVar14->baseOriginal).chars[6] = '\0';
            (pPVar14->baseOriginal).chars[7] = '\0';
            (pPVar14->baseOriginal).chars[8] = '\0';
            (pPVar14->baseOriginal).chars[9] = '\0';
            (pPVar14->baseOriginal).chars[10] = '\0';
            (pPVar14->baseOriginal).chars[0xb] = '\0';
            (pPVar14->baseOriginal).chars[0xc] = '\0';
            (pPVar14->baseOriginal).chars[0xd] = '\0';
            (pPVar14->baseOriginal).chars[0xe] = '\0';
            (pPVar14->baseOriginal).chars[0xf] = '\0';
            (pPVar14->baseOriginal).lengths[0] = '\0';
            (pPVar14->baseOriginal).lengths[1] = '\0';
            (pPVar14->baseOriginal).lengths[2] = '\0';
            (pPVar14->baseOriginal).lengths[3] = '\0';
            (pPVar14->baseOriginal).lengths[4] = '\0';
            (pPVar14->baseOriginal).lengths[5] = '\0';
            (pPVar14->baseOriginal).lengths[6] = '\0';
            (pPVar14->baseOriginal).lengths[7] = '\0';
            (pPVar14->baseOriginal).lengths[8] = '\0';
            (pPVar14->baseOriginal).lengths[9] = '\0';
            (pPVar14->baseOriginal).lengths[10] = '\0';
            (pPVar14->baseOriginal).lengths[0xb] = '\0';
            (pPVar14->baseOriginal).lengths[0xc] = '\0';
            (pPVar14->baseOriginal).lengths[0xd] = '\0';
            (pPVar14->baseOriginal).lengths[0xe] = '\0';
            (pPVar14->baseOriginal).lengths[0xf] = '\0';
            uVar4 = *(undefined8 *)skeleton->type;
            uVar5 = *(undefined8 *)(skeleton->type + 2);
            uVar6 = *(undefined8 *)(skeleton->type + 4);
            uVar7 = *(undefined8 *)(skeleton->type + 6);
            uVar8 = *(undefined8 *)(skeleton->type + 8);
            uVar9 = *(undefined8 *)(skeleton->type + 10);
            uVar10 = *(undefined8 *)(skeleton->type + 0xe);
            *(undefined8 *)(pPVar14->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
            *(undefined8 *)(pPVar14->type + 0xe) = uVar10;
            *(undefined8 *)(pPVar14->type + 8) = uVar8;
            *(undefined8 *)(pPVar14->type + 10) = uVar9;
            *(undefined8 *)(pPVar14->type + 4) = uVar6;
            *(undefined8 *)(pPVar14->type + 6) = uVar7;
            *(undefined8 *)pPVar14->type = uVar4;
            *(undefined8 *)(pPVar14->type + 2) = uVar5;
            uVar4 = *(undefined8 *)((skeleton->original).chars + 8);
            *(undefined8 *)(pPVar14->original).chars = *(undefined8 *)(skeleton->original).chars;
            *(undefined8 *)((pPVar14->original).chars + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->original).lengths + 8);
            *(undefined8 *)(pPVar14->original).lengths = *(undefined8 *)(skeleton->original).lengths
            ;
            *(undefined8 *)((pPVar14->original).lengths + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
            *(undefined8 *)(pPVar14->baseOriginal).chars =
                 *(undefined8 *)(skeleton->baseOriginal).chars;
            *(undefined8 *)((pPVar14->baseOriginal).chars + 8) = uVar4;
            uVar4 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
            *(undefined8 *)(pPVar14->baseOriginal).lengths =
                 *(undefined8 *)(skeleton->baseOriginal).lengths;
            *(undefined8 *)((pPVar14->baseOriginal).lengths + 8) = uVar4;
          }
          LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                    (&pPVar13->skeleton,pPVar14,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            pPVar13->skeletonWasSpecified = skeletonWasSpecified;
            pPVar3 = (pPVar12->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
            if (pPVar3 != (PtnElem *)0x0) {
              (*pPVar3->_vptr_PtnElem[1])();
            }
            (pPVar12->next).super_LocalPointerBase<icu_63::PtnElem>.ptr = pPVar13;
            return;
          }
        }
LAB_002e90fd:
        (*pPVar13->_vptr_PtnElem[1])(pPVar13);
        return;
      }
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

void
PatternMap::add(const UnicodeString& basePattern,
                const PtnSkeleton& skeleton,
                const UnicodeString& value,// mapped pattern value
                UBool skeletonWasSpecified,
                UErrorCode &status) {
    UChar baseChar = basePattern.charAt(0);
    PtnElem *curElem, *baseElem;
    status = U_ZERO_ERROR;

    // the baseChar must be A-Z or a-z
    if ((baseChar >= CAP_A) && (baseChar <= CAP_Z)) {
        baseElem = boot[baseChar-CAP_A];
    }
    else {
        if ((baseChar >=LOW_A) && (baseChar <= LOW_Z)) {
            baseElem = boot[26+baseChar-LOW_A];
         }
         else {
             status = U_ILLEGAL_CHARACTER;
             return;
         }
    }

    if (baseElem == nullptr) {
        LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeletonWasSpecified = skeletonWasSpecified;
        if (baseChar >= LOW_A) {
            boot[26 + (baseChar - LOW_A)] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
        else {
            boot[baseChar - CAP_A] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
    }
    if ( baseElem != nullptr ) {
        curElem = getDuplicateElem(basePattern, skeleton, baseElem);

        if (curElem == nullptr) {
            // add new element to the list.
            curElem = baseElem;
            while( curElem -> next != nullptr )
            {
                curElem = curElem->next.getAlias();
            }

            LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeletonWasSpecified = skeletonWasSpecified;
            curElem->next.adoptInstead(newElem.orphan());
            curElem = curElem->next.getAlias();
        }
        else {
            // Pattern exists in the list already.
            if ( !isDupAllowed ) {
                return;
            }
            // Overwrite the value.
            curElem->pattern = value;
            // It was a bug that we were not doing the following previously,
            // though that bug hid other problems by making things partly work.
            curElem->skeletonWasSpecified = skeletonWasSpecified;
        }
    }
}